

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  uint uVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  U32 UVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  U32 *pUVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  
  pBVar2 = (ms->window).base;
  uVar9 = (ms->cParams).chainLog;
  uVar24 = 1 << ((byte)uVar9 & 0x1f);
  uVar17 = (long)ip - (long)pBVar2;
  uVar14 = ms->nextToUpdate;
  uVar10 = (ulong)uVar14;
  uVar16 = (uint)uVar17;
  uVar15 = uVar16 - uVar24;
  if (uVar16 - uVar14 <= uVar24) {
    uVar15 = uVar14;
  }
  uVar19 = (1 << ((byte)(ms->cParams).searchLog & 0x1f)) - 3;
  uVar12 = 0xff;
  if (uVar19 < 0xff) {
    uVar12 = uVar19;
  }
  uVar26 = (ms->cParams).hashLog;
  uVar13 = uVar26 - 2;
  bVar11 = (byte)uVar13;
  lVar22 = 1L << (bVar11 & 0x3f);
  uVar20 = 3 << (bVar11 & 0x1f);
  uVar25 = uVar16 - uVar20;
  if (uVar16 < uVar20 || uVar25 == 0) {
    uVar25 = uVar14;
  }
  if (0x18 < uVar9) {
    __assert_fail("ms->cParams.chainLog <= 24",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x751f,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar26 <= uVar9) {
    __assert_fail("ms->cParams.hashLog > ms->cParams.chainLog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7520,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar10 == 0) {
    __assert_fail("idx != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7521,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar15 < uVar25) {
    __assert_fail("tmpMinChain <= minChain",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7522,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  pUVar3 = ms->hashTable;
  pUVar18 = ms->chainTable;
  cVar4 = (char)uVar26;
  if (uVar14 < uVar16) {
    if (0x20 < uVar13) goto LAB_00188d50;
    do {
      switch((ms->cParams).minMatch) {
      case 5:
        uVar23 = *(long *)(pBVar2 + uVar10) * -0x30e4432345000000;
        break;
      case 6:
        uVar23 = *(long *)(pBVar2 + uVar10) * -0x30e4432340650000;
        break;
      case 7:
        uVar23 = *(long *)(pBVar2 + uVar10) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar23 = *(long *)(pBVar2 + uVar10) * -0x30e44323485a9b9d;
        break;
      default:
        uVar23 = (ulong)((uint)(*(int *)(pBVar2 + uVar10) * -0x61c8864f) >> (0x22U - cVar4 & 0x1f));
        goto LAB_00188a4c;
      }
      uVar23 = uVar23 >> (0x42U - cVar4 & 0x3f);
LAB_00188a4c:
      if (uVar25 <= uVar10) {
        pUVar3[lVar22 + (ulong)((U32)uVar10 - uVar25)] = pUVar3[uVar23];
      }
      pUVar3[uVar23] = (U32)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar10 < (uVar17 & 0xffffffff));
  }
  uVar14 = 1 << (bVar11 & 0x1f);
  uVar23 = (ulong)uVar14;
  iVar6 = uVar12 + (uVar12 == 0);
  uVar10 = 0;
  uVar9 = 0;
  do {
    uVar12 = pUVar3[uVar10];
    if (uVar12 < uVar25) {
      UVar7 = 0;
    }
    else {
      uVar20 = 0;
      uVar26 = 0;
      do {
        uVar20 = uVar20 + (uVar12 < uVar15);
        uVar1 = uVar26 + 1;
        uVar12 = pUVar3[lVar22 + (ulong)(uVar12 - uVar25)];
        if (uVar12 < uVar25) break;
        bVar27 = uVar26 < 2;
        uVar26 = uVar1;
      } while (bVar27);
      UVar7 = 0;
      if (uVar1 == 3 && uVar19 != 0) {
        iVar5 = 0;
        iVar21 = iVar6 * 0xff;
        do {
          iVar8 = iVar5;
          uVar26 = uVar9 + iVar8;
          if ((uVar12 < uVar15) && ((uVar12 == 0 || (uVar20 = uVar20 + 1, 3 < uVar20)))) {
            UVar7 = uVar9 * 0x100 + iVar8;
            uVar9 = uVar26;
            if (iVar8 == 0) {
              UVar7 = 0;
            }
            goto LAB_00188b66;
          }
          pUVar18[uVar26] = uVar12;
          if (uVar12 < uVar25) {
            UVar7 = uVar9 * 0x100 + iVar8 + 1;
            uVar9 = uVar9 + iVar8 + 1;
            goto LAB_00188b66;
          }
          uVar12 = pUVar3[lVar22 + (ulong)(uVar12 - uVar25)];
          iVar21 = iVar21 + -0x100;
          iVar5 = iVar8 + 1;
        } while (iVar6 != iVar8 + 1);
        UVar7 = uVar9 * 0x100 - iVar21;
        uVar9 = uVar9 + iVar8 + 1;
      }
    }
LAB_00188b66:
    pUVar3[uVar10] = UVar7;
    uVar10 = uVar10 + 1;
  } while (uVar10 != uVar23);
  if (uVar24 < uVar9) {
    __assert_fail("chainPos <= chainSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x755b,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  uVar9 = 4 << (bVar11 & 0x1f);
  pUVar18 = pUVar3 + (uVar14 - 1);
  uVar14 = uVar14 * 4 - 1;
  do {
    uVar9 = uVar9 - 4;
    UVar7 = *pUVar18;
    pUVar18 = pUVar18 + -1;
    uVar10 = (ulong)uVar14;
    uVar14 = uVar14 - 4;
    pUVar3[(ulong)uVar9 + 2] = 0;
    (pUVar3 + uVar9)[0] = 0;
    (pUVar3 + uVar9)[1] = 0;
    pUVar3[uVar10] = UVar7;
    uVar15 = (int)uVar23 - 1;
    uVar23 = (ulong)uVar15;
  } while (uVar15 != 0);
  uVar10 = (ulong)ms->nextToUpdate;
  if (ms->nextToUpdate < uVar16) {
    if (0x20 < uVar13) {
LAB_00188d50:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    do {
      switch((ms->cParams).minMatch) {
      case 5:
        uVar23 = *(long *)(pBVar2 + uVar10) * -0x30e4432345000000;
        break;
      case 6:
        uVar23 = *(long *)(pBVar2 + uVar10) * -0x30e4432340650000;
        break;
      case 7:
        uVar23 = *(long *)(pBVar2 + uVar10) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar23 = *(long *)(pBVar2 + uVar10) * -0x30e44323485a9b9d;
        break;
      default:
        uVar9 = (uint)(*(int *)(pBVar2 + uVar10) * -0x61c8864f) >> (0x22U - cVar4 & 0x1f);
        goto LAB_00188c73;
      }
      uVar9 = (uint)(uVar23 >> (0x42U - cVar4 & 0x3f));
LAB_00188c73:
      uVar23 = (ulong)(uVar9 << 2);
      *(undefined8 *)(pUVar3 + uVar23 + 1) = *(undefined8 *)(pUVar3 + uVar23);
      pUVar3[uVar23] = (U32)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar10 < (uVar17 & 0xffffffff));
  }
  ms->nextToUpdate = uVar16;
  return;
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target - idx ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = (U32)((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}